

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O2

unsigned_short * __thiscall
density::heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>::
consume_operation::element<unsigned_short>(consume_operation *this)

{
  runtime_type<> *prVar1;
  unsigned_short *puVar2;
  
  if (*(long *)(this + 8) != 0) {
    prVar1 = complete_type(this);
    if (prVar1->m_feature_table ==
        (tuple_type *)
        detail::
        FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,unsigned_short>
        ::s_table) goto LAB_00ff81b1;
  }
  density_tests::detail::assert_failed<>
            ("!empty() && complete_type().template is<COMPLETE_ELEMENT_TYPE>()",
             "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/heter_queue.h"
             ,0x415);
LAB_00ff81b1:
  puVar2 = (unsigned_short *)
           heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>::
           get_element(*(QueueControl **)(this + 8));
  return puVar2;
}

Assistant:

COMPLETE_ELEMENT_TYPE & element() const noexcept
            {
                DENSITY_ASSERT(!empty() && complete_type().template is<COMPLETE_ELEMENT_TYPE>());
                return *static_cast<COMPLETE_ELEMENT_TYPE *>(get_element(m_control));
            }